

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_pattern(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  undefined4 uVar15;
  int nr;
  undefined8 uVar16;
  int n_node;
  uint uVar17;
  uint uVar18;
  xmlNodePtr in_RSI;
  undefined8 uVar19;
  int test_ret;
  int iVar20;
  undefined8 *puVar21;
  ulong uVar22;
  undefined4 *puVar23;
  int test_ret_3;
  int test_ret_2;
  int test_ret_1;
  int local_38;
  int local_34;
  
  if (quiet == '\0') {
    puts("Testing pattern : 10 of 15 functions ...");
  }
  iVar1 = xmlMemBlocks();
  xmlPatternFromRoot(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar2 = xmlMemBlocks();
  if (iVar1 != iVar2) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlPatternFromRoot");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar17 = 0;
  iVar20 = 0;
  do {
    iVar4 = (int)in_RSI;
    iVar3 = xmlMemBlocks();
    in_RSI = gen_xmlNodePtr(uVar17,iVar4);
    xmlPatternMatch(0,in_RSI);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar17,in_RSI,nr);
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlPatternMatch",(ulong)(uint)(iVar4 - iVar3));
      iVar20 = iVar20 + 1;
      printf(" %d",0);
      in_RSI = (xmlNodePtr)(ulong)uVar17;
      printf(" %d");
      putchar(10);
    }
    uVar17 = uVar17 + 1;
  } while (uVar17 != 3);
  function_tests = function_tests + 1;
  iVar3 = xmlMemBlocks();
  xmlPatternMaxDepth(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar4 = xmlMemBlocks();
  if (iVar3 != iVar4) {
    iVar5 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlPatternMaxDepth",(ulong)(uint)(iVar5 - iVar3));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar5 = xmlMemBlocks();
  xmlPatternMinDepth(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar6 = xmlMemBlocks();
  if (iVar5 != iVar6) {
    iVar7 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlPatternMinDepth",(ulong)(uint)(iVar7 - iVar5));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar7 = xmlMemBlocks();
  xmlPatternStreamable(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar8 = xmlMemBlocks();
  if (iVar7 != iVar8) {
    iVar9 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlPatternStreamable",(ulong)(uint)(iVar9 - iVar7));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar9 = xmlMemBlocks();
  xmlStreamPop(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar10 = xmlMemBlocks();
  if (iVar9 != iVar10) {
    iVar11 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlStreamPop",(ulong)(uint)(iVar11 - iVar9));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  local_34 = 0;
  uVar17 = 0;
  do {
    puVar21 = &DAT_00162d68;
    uVar18 = 0;
    do {
      iVar11 = xmlMemBlocks();
      if (uVar17 < 4) {
        uVar19 = (&DAT_00162d68)[uVar17];
      }
      else {
        uVar19 = 0;
      }
      if (uVar18 < 4) {
        uVar16 = *puVar21;
      }
      else {
        uVar16 = 0;
      }
      xmlStreamPush(0,uVar19,uVar16);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar12 = xmlMemBlocks();
      if (iVar11 != iVar12) {
        iVar12 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlStreamPush",(ulong)(uint)(iVar12 - iVar11));
        local_34 = local_34 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar17);
        printf(" %d");
        putchar(10);
      }
      uVar18 = uVar18 + 1;
      puVar21 = puVar21 + 1;
    } while (uVar18 != 5);
    uVar17 = uVar17 + 1;
  } while (uVar17 != 5);
  function_tests = function_tests + 1;
  local_38 = 0;
  uVar17 = 0;
  do {
    puVar21 = &DAT_00162d68;
    uVar18 = 0;
    do {
      iVar11 = xmlMemBlocks();
      if (uVar17 < 4) {
        uVar19 = (&DAT_00162d68)[uVar17];
      }
      else {
        uVar19 = 0;
      }
      if (uVar18 < 4) {
        uVar16 = *puVar21;
      }
      else {
        uVar16 = 0;
      }
      xmlStreamPushAttr(0,uVar19,uVar16);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar12 = xmlMemBlocks();
      if (iVar11 != iVar12) {
        iVar12 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlStreamPushAttr",(ulong)(uint)(iVar12 - iVar11));
        local_38 = local_38 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar17);
        printf(" %d");
        putchar(10);
      }
      uVar18 = uVar18 + 1;
      puVar21 = puVar21 + 1;
    } while (uVar18 != 5);
    uVar17 = uVar17 + 1;
  } while (uVar17 != 5);
  function_tests = function_tests + 1;
  iVar11 = 0;
  uVar17 = 0;
  do {
    uVar22 = 0;
    do {
      uVar18 = 0;
      puVar23 = &DAT_0015fd28;
      do {
        iVar12 = xmlMemBlocks();
        if (uVar17 < 4) {
          uVar19 = (&DAT_00162d68)[uVar17];
        }
        else {
          uVar19 = 0;
        }
        if ((uint)uVar22 < 4) {
          uVar16 = (&DAT_00162d68)[uVar22];
        }
        else {
          uVar16 = 0;
        }
        uVar15 = 0xffffffff;
        if (uVar18 < 4) {
          uVar15 = *puVar23;
        }
        xmlStreamPushNode(0,uVar19,uVar16,uVar15);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar13 = xmlMemBlocks();
        if (iVar12 != iVar13) {
          iVar13 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlStreamPushNode",(ulong)(uint)(iVar13 - iVar12));
          iVar11 = iVar11 + 1;
          printf(" %d",0);
          printf(" %d",(ulong)uVar17);
          printf(" %d",uVar22);
          printf(" %d");
          putchar(10);
        }
        uVar18 = uVar18 + 1;
        puVar23 = puVar23 + 1;
      } while (uVar18 != 4);
      uVar18 = (uint)uVar22 + 1;
      uVar22 = (ulong)uVar18;
    } while (uVar18 != 5);
    uVar17 = uVar17 + 1;
  } while (uVar17 != 5);
  function_tests = function_tests + 1;
  iVar12 = xmlMemBlocks();
  xmlStreamWantsAnyNode(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar13 = xmlMemBlocks();
  if (iVar12 != iVar13) {
    iVar14 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlStreamWantsAnyNode",(ulong)(uint)(iVar14 - iVar12));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar17 = local_38 + iVar11 +
           iVar20 + (uint)(iVar1 != iVar2) + (uint)(iVar3 != iVar4) + (uint)(iVar5 != iVar6) +
           (uint)(iVar7 != iVar8) + (uint)(iVar9 != iVar10) + local_34 + (uint)(iVar12 != iVar13);
  if (uVar17 != 0) {
    printf("Module pattern: %d errors\n",(ulong)uVar17);
  }
  return uVar17;
}

Assistant:

static int
test_pattern(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing pattern : 10 of 15 functions ...\n");
    test_ret += test_xmlPatternFromRoot();
    test_ret += test_xmlPatternGetStreamCtxt();
    test_ret += test_xmlPatternMatch();
    test_ret += test_xmlPatternMaxDepth();
    test_ret += test_xmlPatternMinDepth();
    test_ret += test_xmlPatternStreamable();
    test_ret += test_xmlPatterncompile();
    test_ret += test_xmlStreamPop();
    test_ret += test_xmlStreamPush();
    test_ret += test_xmlStreamPushAttr();
    test_ret += test_xmlStreamPushNode();
    test_ret += test_xmlStreamWantsAnyNode();

    if (test_ret != 0)
	printf("Module pattern: %d errors\n", test_ret);
    return(test_ret);
}